

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O3

vec2f __thiscall hmi::renderer::get_coords_from_position(renderer *this,vec2i position)

{
  vec2f vVar1;
  float fVar2;
  float fVar3;
  mat3f inverse_transform;
  undefined1 local_68 [36];
  mat3f local_44;
  
  SDL_GL_GetDrawableSize
            (this->m_window,(anon_union_36_10_b4d23817_for_mat<float,_3UL>_2 *)local_68,
             (float *)((long)((anon_union_36_10_b4d23817_for_mat<float,_3UL>_2 *)local_68)->data[0]
                      + 4));
  fVar3 = ((float)position.field_0._0_4_ + (float)position.field_0._0_4_) /
          (float)(int)local_68._0_4_ + -1.0;
  fVar2 = 1.0 - ((float)position.field_0._4_4_ + (float)position.field_0._4_4_) /
                (float)(int)local_68._4_4_;
  get_view_matrix(&local_44,this);
  invert<float>((mat<float,_3UL> *)
                &((anon_union_36_10_b4d23817_for_mat<float,_3UL>_2 *)local_68)->xx,&local_44);
  vVar1.field_0.data[1] =
       (float)local_68._20_4_ + fVar3 * (float)local_68._12_4_ + (float)local_68._16_4_ * fVar2;
  vVar1.field_0.data[0] =
       (float)local_68._8_4_ + fVar3 * (float)local_68._0_4_ + (float)local_68._4_4_ * fVar2;
  return (vec2f)vVar1.field_0;
}

Assistant:

vec2f renderer::get_coords_from_position(vec2i position) {
    vec2f viewport_position = { 0.0f, 0.0f };
    vec2f viewport_size = get_size();

    vec2f normalized;
    normalized.x = 2.0f * (position.x - viewport_position.x) / viewport_size.width - 1;
    normalized.y = 1 - 2.0f * (position.y - viewport_position.y) / viewport_size.height;

    mat3f inverse_transform = invert(get_view_matrix());

    return affine_transform(inverse_transform, normalized);
  }